

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ReportPropertyOrigin
          (cmGeneratorTarget *this,string *p,string *result,string *report,string *compatibilityType
          )

{
  bool bVar1;
  cmMakefile *this_00;
  char *__s;
  mapped_type *pmVar2;
  string *psVar3;
  cmake *this_01;
  bool local_1f1;
  cmListFileBacktrace local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [39];
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string areport;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  bool local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [6];
  bool debugOrigin;
  allocator<char> local_81;
  string local_80;
  char *local_50;
  char *debugProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string *compatibilityType_local;
  string *report_local;
  string *result_local;
  string *p_local;
  cmGeneratorTarget *this_local;
  
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = compatibilityType;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&debugProp);
  this_00 = cmTarget::GetMakefile(this->Target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_DEBUG_TARGET_PROPERTIES",&local_81);
  __s = cmMakefile::GetDefinition(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_50 = __s;
  if (__s != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,__s,&local_a9);
    cmSystemTools::ExpandListArgument
              ((string *)local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&debugProp,false);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  local_1f1 = false;
  if ((*pmVar2 & 1U) == 0) {
    local_c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&debugProp);
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&debugProp);
    local_b8 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_c0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_c8,p);
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&debugProp);
    local_1f1 = __gnu_cxx::operator!=(&local_b8,&local_d0);
  }
  local_aa = local_1f1;
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar2 = true;
  }
  bVar1 = (local_aa & 1U) != 0;
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)local_f8,
               (string *)
               debugProperties.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158," of property \"",&local_159);
    std::operator+(&local_138,&local_158,p);
    std::operator+(&local_118,&local_138,"\" for target \"");
    std::__cxx11::string::operator+=((string *)local_f8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::string(local_180,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)local_f8,local_180);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::operator+=((string *)local_f8,"\" (result: \"");
    std::__cxx11::string::operator+=((string *)local_f8,(string *)result);
    std::operator+(&local_1a0,"\"):\n",report);
    std::__cxx11::string::operator+=((string *)local_f8,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    local_1b8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_1b8);
    cmake::IssueMessage(this_01,LOG,(string *)local_f8,&local_1b8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1b8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  areport.field_2._13_3_ = 0;
  areport.field_2._M_local_buf[0xc] = !bVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&debugProp);
  return;
}

Assistant:

void cmGeneratorTarget::ReportPropertyOrigin(
  const std::string& p, const std::string& result, const std::string& report,
  const std::string& compatibilityType) const
{
  std::vector<std::string> debugProperties;
  const char* debugProp = this->Target->GetMakefile()->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p] &&
    std::find(debugProperties.begin(), debugProperties.end(), p) !=
      debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugCompatiblePropertiesDone[p] = true;
  }
  if (!debugOrigin) {
    return;
  }

  std::string areport = compatibilityType;
  areport += std::string(" of property \"") + p + "\" for target \"";
  areport += std::string(this->GetName());
  areport += "\" (result: \"";
  areport += result;
  areport += "\"):\n" + report;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(MessageType::LOG,
                                                         areport);
}